

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::ConsoleReporter>(ContextOptions *o)

{
  ConsoleReporter *this;
  ContextOptions *in_stack_ffffffffffffffd8;
  
  this = (ConsoleReporter *)operator_new(0x70);
  anon_unknown_14::ConsoleReporter::ConsoleReporter(this,in_stack_ffffffffffffffd8);
  return &this->super_IReporter;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
            return new Reporter(o);
        }